

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

void init_race_probs(void)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  void *p;
  void *p_00;
  void *p_01;
  void *pvVar4;
  level_conflict *plVar5;
  level_conflict *plVar6;
  level_conflict *plVar7;
  level_conflict *plVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  level_map_conflict *map;
  player_race *ppVar16;
  ulong uVar17;
  long lVar18;
  
  race_prob = (int **)mem_zalloc((ulong)z_info->p_race_max << 3);
  if (z_info->p_race_max != 0) {
    uVar17 = 0;
    do {
      piVar3 = (int *)mem_zalloc((long)world->num_levels << 2);
      race_prob[uVar17] = piVar3;
      uVar17 = uVar17 + 1;
    } while (uVar17 < z_info->p_race_max);
  }
  p = mem_zalloc((long)world->num_levels << 3);
  p_00 = mem_zalloc((long)world->num_levels << 3);
  p_01 = mem_zalloc((long)world->num_levels << 3);
  uVar17 = (ulong)(uint)world->num_levels;
  map = world;
  if (0 < world->num_levels) {
    lVar18 = 0;
    do {
      pvVar4 = mem_zalloc((long)(int)uVar17 << 2);
      *(void **)((long)p + lVar18 * 8) = pvVar4;
      pvVar4 = mem_zalloc((long)world->num_levels << 2);
      *(void **)((long)p_00 + lVar18 * 8) = pvVar4;
      pvVar4 = mem_zalloc((long)world->num_levels << 2);
      *(void **)((long)p_01 + lVar18 * 8) = pvVar4;
      lVar18 = lVar18 + 1;
      uVar17 = (ulong)world->num_levels;
    } while (lVar18 < (long)uVar17);
    map = world;
    if (0 < world->num_levels) {
      lVar18 = 0;
      do {
        plVar8 = map->levels;
        if (plVar8[lVar18].north == (char *)0x0) {
          plVar5 = (level_conflict *)0x0;
        }
        else {
          plVar5 = level_by_name(map,plVar8[lVar18].north);
          map = world;
        }
        if (plVar8[lVar18].east == (char *)0x0) {
          plVar6 = (level_conflict *)0x0;
        }
        else {
          plVar6 = level_by_name(map,plVar8[lVar18].east);
          map = world;
        }
        if (plVar8[lVar18].south == (char *)0x0) {
          plVar7 = (level_conflict *)0x0;
        }
        else {
          plVar7 = level_by_name(map,plVar8[lVar18].south);
          map = world;
        }
        if (plVar8[lVar18].west == (char *)0x0) {
          plVar8 = (level_conflict *)0x0;
        }
        else {
          plVar8 = level_by_name(map,plVar8[lVar18].west);
          map = world;
        }
        if (0 < map->num_levels) {
          lVar13 = *(long *)((long)p + lVar18 * 8);
          lVar2 = *(long *)((long)p_00 + lVar18 * 8);
          lVar12 = *(long *)((long)p_01 + lVar18 * 8);
          lVar11 = 0;
          do {
            *(undefined4 *)(lVar13 + lVar11 * 4) = 0;
            *(undefined4 *)(lVar2 + lVar11 * 4) = 0;
            *(undefined4 *)(lVar12 + lVar11 * 4) = 0;
            lVar11 = lVar11 + 1;
          } while (lVar11 < map->num_levels);
        }
        if (plVar5 != (level_conflict *)0x0) {
          *(undefined4 *)(*(long *)((long)p + lVar18 * 8) + (long)plVar5->index * 4) = 1;
          *(undefined4 *)(*(long *)((long)p_01 + lVar18 * 8) + (long)plVar5->index * 4) = 1;
        }
        if (plVar6 != (level_conflict *)0x0) {
          *(undefined4 *)(*(long *)((long)p + lVar18 * 8) + (long)plVar6->index * 4) = 1;
          *(undefined4 *)(*(long *)((long)p_01 + lVar18 * 8) + (long)plVar6->index * 4) = 1;
        }
        if (plVar7 != (level_conflict *)0x0) {
          *(undefined4 *)(*(long *)((long)p + lVar18 * 8) + (long)plVar7->index * 4) = 1;
          *(undefined4 *)(*(long *)((long)p_01 + lVar18 * 8) + (long)plVar7->index * 4) = 1;
        }
        if (plVar8 != (level_conflict *)0x0) {
          *(undefined4 *)(*(long *)((long)p + lVar18 * 8) + (long)plVar8->index * 4) = 1;
          *(undefined4 *)(*(long *)((long)p_01 + lVar18 * 8) + (long)plVar8->index * 4) = 1;
        }
        lVar18 = lVar18 + 1;
        uVar17 = (ulong)map->num_levels;
      } while (lVar18 < (long)uVar17);
    }
  }
  iVar10 = 0;
  do {
    if (0 < (int)uVar17) {
      lVar18 = 0;
      do {
        if ((int)uVar17 < 1) {
          lVar13 = (long)(int)uVar17;
        }
        else {
          lVar2 = *(long *)((long)p_00 + lVar18 * 8);
          lVar12 = 0;
          do {
            *(undefined4 *)(lVar2 + lVar12 * 4) = 0;
            uVar1 = map->num_levels;
            lVar13 = (long)(int)uVar1;
            if (0 < lVar13) {
              lVar11 = *(long *)((long)p_01 + lVar18 * 8);
              iVar14 = 0;
              lVar15 = 0;
              do {
                iVar14 = iVar14 + *(int *)(*(long *)((long)p_01 + lVar15 * 8) + lVar12 * 4) *
                                  *(int *)(lVar11 + lVar15 * 4);
                *(int *)(lVar2 + lVar12 * 4) = iVar14;
                lVar15 = lVar15 + 1;
                uVar1 = map->num_levels;
                lVar13 = (long)(int)uVar1;
              } while (lVar15 < lVar13);
            }
            uVar17 = (ulong)uVar1;
            lVar12 = lVar12 + 1;
          } while (lVar12 < lVar13);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < lVar13);
      if (0 < (int)uVar17) {
        lVar18 = 0;
        do {
          if ((int)uVar17 < 1) {
            lVar13 = (long)(int)uVar17;
          }
          else {
            lVar2 = *(long *)((long)p_00 + lVar18 * 8);
            lVar12 = *(long *)((long)p_01 + lVar18 * 8);
            lVar11 = 0;
            do {
              *(undefined4 *)(lVar12 + lVar11 * 4) = *(undefined4 *)(lVar2 + lVar11 * 4);
              lVar11 = lVar11 + 1;
              uVar17 = (ulong)(uint)map->num_levels;
              lVar13 = (long)map->num_levels;
            } while (lVar11 < lVar13);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < lVar13);
      }
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  if (0 < (int)uVar17) {
    lVar18 = 0;
    do {
      if ((int)uVar17 < 1) {
        lVar13 = (long)(int)uVar17;
      }
      else {
        lVar2 = *(long *)((long)p_00 + lVar18 * 8);
        lVar12 = *(long *)((long)p_01 + lVar18 * 8);
        lVar11 = 0;
        do {
          *(undefined4 *)(lVar2 + lVar11 * 4) = 0;
          uVar17 = (ulong)(uint)map->num_levels;
          iVar10 = 0;
          if (0 < map->num_levels) {
            lVar13 = 0;
            do {
              iVar10 = iVar10 + *(int *)(*(long *)((long)p + lVar13 * 8) + lVar11 * 4) *
                                *(int *)(lVar12 + lVar13 * 4);
              *(int *)(lVar2 + lVar11 * 4) = iVar10;
              lVar13 = lVar13 + 1;
              uVar17 = (ulong)map->num_levels;
            } while (lVar13 < (long)uVar17);
          }
          iVar14 = *(int *)(lVar12 + lVar11 * 4);
          if (iVar10 < iVar14) {
            *(int *)(lVar2 + lVar11 * 4) = iVar14;
            uVar17 = (ulong)(uint)map->num_levels;
          }
          lVar11 = lVar11 + 1;
          lVar13 = (long)(int)uVar17;
        } while (lVar11 < lVar13);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar13);
    if (0 < (int)uVar17) {
      lVar18 = 0;
      do {
        if (races != (player_race *)0x0) {
          iVar10 = 0;
          ppVar16 = races;
          do {
            pcVar9 = strstr(map->name,"Dungeon");
            lVar13 = 1;
            if (pcVar9 == (char *)0x0) {
              plVar8 = level_by_name(map,ppVar16->hometown);
              lVar13 = (long)plVar8->index;
              map = world;
            }
            iVar10 = iVar10 + 1 +
                     *(int *)(*(long *)((long)p_00 + (long)map->levels[lVar13].index * 8) +
                             lVar18 * 4);
            race_prob[ppVar16->ridx][lVar18] = iVar10;
            ppVar16 = ppVar16->next;
          } while (ppVar16 != (player_race *)0x0);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < map->num_levels);
      if (0 < map->num_levels) {
        lVar18 = 0;
        do {
          mem_free(*(void **)((long)p_01 + lVar18 * 8));
          mem_free(*(void **)((long)p + lVar18 * 8));
          mem_free(*(void **)((long)p_00 + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while (lVar18 < world->num_levels);
      }
    }
  }
  mem_free(p_01);
  mem_free(p);
  mem_free(p_00);
  return;
}

Assistant:

void init_race_probs(void)
{
	int i, j, k, n;
	int **adjacency, **lev_path, **temp_path;

	/* Make the array */
	race_prob = mem_zalloc(z_info->p_race_max * sizeof(int*));
	for (i = 0; i < z_info->p_race_max; i++) {
		race_prob[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Prepare temporary adjacency arrays */
	adjacency = mem_zalloc(world->num_levels * sizeof(int*));
	lev_path = mem_zalloc(world->num_levels * sizeof(int*));
	temp_path = mem_zalloc(world->num_levels * sizeof(int*));
	for (i = 0; i < world->num_levels; i++) {
		adjacency[i] = mem_zalloc(world->num_levels * sizeof(int));
		lev_path[i] = mem_zalloc(world->num_levels * sizeof(int));
		temp_path[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Make the adjacency matrix */
	for (i = 0; i < world->num_levels; i++) {
		/* Get the horizontally adjacent levels */
		struct level *lev = &world->levels[i];
		struct level *north = NULL;
		struct level *east = NULL;
		struct level *south = NULL;
		struct level *west = NULL;
		if (lev->north) north = level_by_name(world, lev->north);
		if (lev->east) east = level_by_name(world, lev->east);
		if (lev->south) south = level_by_name(world, lev->south);
		if (lev->west) west = level_by_name(world, lev->west);

		/* Initialise this row */
		for (k = 0; k < world->num_levels; k++) {
			adjacency[i][k] = 0;
			lev_path[i][k] = 0;
			temp_path[i][k] = 0;
		}

		/* Add 1s where there's an adjacent stage (not up or down) */
		if (north) {
			adjacency[i][north->index] = 1;
			temp_path[i][north->index] = 1;
		}
		if (east) {
			adjacency[i][east->index] = 1;
			temp_path[i][east->index] = 1;
		}
		if (south) {
			adjacency[i][south->index] = 1;
			temp_path[i][south->index] = 1;
		}
		if (west) {
			adjacency[i][west->index] = 1;
			temp_path[i][west->index] = 1;
		}
	}

	/* Power it up (squaring 3 times gives eighth power) */
	for (n = 0; n < 3; n++) {
		/* Square */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				lev_path[i][j] = 0;
				for (k = 0; k < world->num_levels; k++) {
					lev_path[i][j] += temp_path[i][k] * temp_path[k][j];
				}
			}
		}

		/* Copy it over for the next squaring or final multiply */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				temp_path[i][j] = lev_path[i][j];
			}
		}
	}

	/* Get the max of length 8 and length 9 paths */
	for (i = 0; i < world->num_levels; i++) {
		for (j = 0; j < world->num_levels; j++) {
			/* Multiply to get the length 9s */
			lev_path[i][j] = 0;
			for (k = 0; k < world->num_levels; k++) {
				lev_path[i][j] += temp_path[i][k] * adjacency[k][j];
			}

			/* Now replace by the length 8s if it's larger */
			if (lev_path[i][j] < temp_path[i][j]) {
				lev_path[i][j] = temp_path[i][j];
			}
		}
	}

	/* We now have the maximum of the number of paths of length 8 and the
	 * number of paths of length 9 (we need to try odd and even length paths,
	 * as using just one leads to anomalies) from any level to any other,
	 * which we will use as a basis for the racial probability table for
	 * racially based monsters in any given level.  For a level, we give
	 * every race a 1, then add the number of paths of length 8 from their
	 * hometown to that level.  We then turn every row entry into the
	 * cumulative total of the row to that point.  Whenever a racially based
	 * monster is called for, we will take a random integer less than the
	 * last entry of the row for that level, and proceed along the row,
	 * allocating the race corresponding to the position where we first
	 * exceed that integer.
	 */
	for (i = 0; i < world->num_levels; i++) {
		int prob = 0;
		struct player_race *p_race = races;
		while (p_race) {
			int hometown = 	strstr(world->name, "Dungeon") ? 1 :
				level_by_name(world, p_race->hometown)->index;
			/* Enter the cumulative probability */
			prob += 1 + lev_path[world->levels[hometown].index][i];
			race_prob[p_race->ridx][i] = prob;
			p_race = p_race->next;
		}
	}

	/* Free the temporary arrays */
	for (i = 0; i < world->num_levels; i++) {
		mem_free(temp_path[i]);
		mem_free(adjacency[i]);
		mem_free(lev_path[i]);
	}
	mem_free(temp_path);
	mem_free(adjacency);
	mem_free(lev_path);
}